

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

uint64_t __thiscall ImgfsFile::allocent(ImgfsFile *this,entrytype_t tag)

{
  pointer puVar1;
  element_type *peVar2;
  undefined8 *puVar3;
  void *pvVar4;
  uint32_t uVar5;
  __normal_iterator<ImgfsFile::entrytype_t_*,_std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>_>
  _Var6;
  uint64_t ofs;
  undefined7 in_register_00000031;
  uint uVar7;
  ByteVector block;
  allocator_type local_4e;
  value_type_conflict2 local_4d;
  undefined4 local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       CONCAT31(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._1_3_,0x20);
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<ImgfsFile::entrytype_t*,std::vector<ImgfsFile::entrytype_t,std::allocator<ImgfsFile::entrytype_t>>>,__gnu_cxx::__ops::_Iter_equals_val<ImgfsFile::entrytype_t_const>>
                    ((this->_entrymap).
                     super__Vector_base<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->_entrymap).
                     super__Vector_base<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var6._M_current ==
      (this->_entrymap).
      super__Vector_base<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar1 = (this->_dir2file).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((this->_dir2file).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start == puVar1) {
      uVar7 = 0;
    }
    else {
      uVar7 = (this->_hdr).bytesperblock * puVar1[-1];
    }
    local_4c = (undefined4)CONCAT71(in_register_00000031,tag);
    uVar5 = allocdirblock(this);
    if (g_verbose != 0) {
      printf("added new dir block [%08x -> %08x]\n",(ulong)uVar7,(ulong)uVar5);
    }
    registerdirblock(this,(ulong)uVar5);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         CONCAT31(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start._1_3_,0x20);
    std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::resize
              (&this->_entrymap,
               (ulong)(this->_hdr).entriesperblock *
               ((long)(this->_dir2file).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_dir2file).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2),(value_type *)&local_48);
    peVar2 = (this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_ReadWriter[4])(peVar2,(ulong)uVar7);
    peVar2 = (this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x2f5314ce;
    (*peVar2->_vptr_ReadWriter[3])(peVar2,&local_48,4);
    peVar2 = (this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar5;
    (*peVar2->_vptr_ReadWriter[3])(peVar2,&local_48,4);
    peVar2 = (this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_ReadWriter[4])(peVar2,(ulong)uVar5);
    local_4d = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(ulong)(this->_hdr).bytesperblock,&local_4d,&local_4e);
    puVar3 = (undefined8 *)
             CONCAT44(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint32_t)
                      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    *puVar3 = 0x2f5314ce;
    peVar2 = (this->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_ReadWriter[3])
              (peVar2,puVar3,
               (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
    ofs = (uint64_t)(uVar5 + 8);
    markent(this,ofs,(entrytype_t)local_4c);
    pvVar4 = (void *)CONCAT44(local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint32_t)
                              local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_48.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4
                     );
    }
  }
  else {
    ofs = index2entryofs(this,(int)_Var6._M_current -
                              *(int *)&(this->_entrymap).
                                       super__Vector_base<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
    markent(this,ofs,tag);
  }
  return ofs;
}

Assistant:

uint64_t allocent(entrytype_t tag)
    {
        // NOTE: performance warning - linear search
        entrymap_t::iterator i= std::find(_entrymap.begin(), _entrymap.end(), FREEENTRY);
        if (i==_entrymap.end()) {
            unsigned prevblockofs= _dir2file.empty() ? 0 : _dir2file.back()*_hdr.bytesperblock;
            uint32_t newdirblockofs= allocdirblock();

            if (g_verbose)
                printf("added new dir block [%08x -> %08x]\n", prevblockofs, newdirblockofs);
            registerdirblock(newdirblockofs);
            _entrymap.resize(_dir2file.size()*_hdr.entriesperblock, FREEENTRY);
            // link to previous block
            _rd->setpos(prevblockofs);
            _rd->write32le(0x2f5314ce);
            _rd->write32le(newdirblockofs);

            _rd->setpos(newdirblockofs);
            ByteVector block(_hdr.bytesperblock, 0xff);
            set32le(&block[0], 0x2f5314ce);
            set32le(&block[4], 0);
            _rd->write(&block[0], block.size());
            //printf("write empty dirblock at %08x\n", newdirblockofs);

            i= _entrymap.end()-_hdr.entriesperblock;

            uint64_t ofs= newdirblockofs+8;
            markent(ofs, tag);
            return ofs;
        }
        uint64_t ofs= index2entryofs(i-_entrymap.begin());
//        printf("allocent(%c) -> %d : %d : %08llx\n", tag, int(i-_entrymap.begin()), *i, ofs);
        markent(ofs, tag);

        return ofs;
    }